

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoop::printActiveChannels(EventLoop *this)

{
  pointer ppCVar1;
  Channel *this_00;
  size_type sVar2;
  pointer ppCVar3;
  int iVar4;
  SourceFile file;
  Logger local_1020;
  string local_50;
  
  ppCVar3 = (this->m_activeChannels).
            super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_activeChannels).
            super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar3 != ppCVar1) {
    iVar4 = (int)&local_1020 + 0xfb0;
    do {
      if (g_logLevel < 1) {
        this_00 = *ppCVar3;
        file._8_8_ = 0xd;
        file.m_data = "EventLoop.cpp";
        Logger::Logger(&local_1020,file,0x149,TRACE,"printActiveChannels");
        if ((iVar4 - (int)local_1020.m_impl.m_stream.m_buffer.m_cur & 0xfffffffeU) != 0) {
          *local_1020.m_impl.m_stream.m_buffer.m_cur = '{';
          local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 1;
        }
        Channel::reventsToString_abi_cxx11_(&local_50,this_00);
        sVar2 = local_50._M_string_length;
        if (local_50._M_string_length <
            (ulong)(long)(iVar4 - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)) {
          memcpy(local_1020.m_impl.m_stream.m_buffer.m_cur,local_50._M_dataplus._M_p,
                 local_50._M_string_length);
          local_1020.m_impl.m_stream.m_buffer.m_cur =
               local_1020.m_impl.m_stream.m_buffer.m_cur + sVar2;
        }
        if (2 < (uint)(iVar4 - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)) {
          local_1020.m_impl.m_stream.m_buffer.m_cur[0] = '}';
          local_1020.m_impl.m_stream.m_buffer.m_cur[1] = ' ';
          local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 2;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        Logger::~Logger(&local_1020);
      }
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 != ppCVar1);
  }
  return;
}

Assistant:

void EventLoop::printActiveChannels() const
{
	for (const Channel* channel : m_activeChannels)
	{
		LOG_TRACE << "{" << channel->reventsToString() << "} ";
	}
}